

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

_Bool sx_semaphore_wait(sx_sem *sem,int msecs)

{
  code *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 local_38 [7];
  _Bool ok;
  timespec ts;
  int r;
  sx__sem *_sem;
  int msecs_local;
  sx_sem *sem_local;
  
  ts.tv_nsec._4_4_ = pthread_mutex_lock((pthread_mutex_t *)sem);
  if (ts.tv_nsec._4_4_ == 0) {
    if (msecs == -1) {
      while( true ) {
        bVar3 = false;
        if (ts.tv_nsec._4_4_ == 0) {
          bVar3 = *(int *)(sem->data + 0x58) < 1;
        }
        if (!bVar3) break;
        ts.tv_nsec._4_4_ =
             pthread_cond_wait((pthread_cond_t *)(sem->data + 0x28),(pthread_mutex_t *)sem);
      }
    }
    else {
      clock_gettime(0,(timespec *)local_38);
      sx__tm_add((timespec *)local_38,msecs);
      while( true ) {
        bVar3 = false;
        if (ts.tv_nsec._4_4_ == 0) {
          bVar3 = *(int *)(sem->data + 0x58) < 1;
        }
        if (!bVar3) break;
        ts.tv_nsec._4_4_ =
             pthread_cond_timedwait
                       ((pthread_cond_t *)(sem->data + 0x28),(pthread_mutex_t *)sem,
                        (timespec *)local_38);
      }
    }
    bVar3 = ts.tv_nsec._4_4_ == 0;
    if (bVar3) {
      *(int *)(sem->data + 0x58) = *(int *)(sem->data + 0x58) + -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)sem);
    return bVar3;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                    0x1bf,"r == 0");
  pcVar1 = (code *)swi(3);
  uVar2 = (*pcVar1)();
  return (_Bool)uVar2;
}

Assistant:

bool sx_semaphore_wait(sx_sem* sem, int msecs)
{
    sx__sem* _sem = (sx__sem*)sem->data;
    int r = pthread_mutex_lock(&_sem->mutex);
    sx_assert(r == 0);

    if (msecs == -1) {
        while (r == 0 && _sem->count <= 0) r = pthread_cond_wait(&_sem->cond, &_sem->mutex);
    } else {
        struct timespec ts;
        clock_gettime(CLOCK_REALTIME, &ts);
        sx__tm_add(&ts, msecs);
        while (r == 0 && _sem->count <= 0)
            r = pthread_cond_timedwait(&_sem->cond, &_sem->mutex, &ts);
    }

    bool ok = r == 0;
    if (ok) {
        --_sem->count;
    }
    r = pthread_mutex_unlock(&_sem->mutex);
    sx_unused(r);
    return ok;
}